

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSpeedup(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_50;
  uint local_4c;
  int fVeryVerbose;
  int fVerbose;
  int Degree;
  int Percentage;
  int fUseLutLib;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Degree = 0;
  fVerbose = 5;
  fVeryVerbose = 2;
  local_4c = 0;
  local_50 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"PNlvwh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsLogic(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command can only be applied to a logic network.\n");
        return 1;
      }
      pAVar2 = Abc_NtkSpeedup(pAVar2,Degree,fVerbose,fVeryVerbose,local_4c,local_50);
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"The command has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
    switch(iVar1) {
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
LAB_00263c15:
        Abc_Print(-2,"usage: speedup [-PN <num>] [-lvwh]\n");
        Abc_Print(-2,"\t           transforms LUT-mapped network into an AIG with choices;\n");
        Abc_Print(-2,"\t           the choices are added to speedup the next round of mapping\n");
        Abc_Print(-2,
                  "\t-P <num> : delay delta defining critical path for library model [default = %d%%]\n"
                  ,(ulong)(uint)fVerbose);
        Abc_Print(-2,
                  "\t-N <num> : the max critical path degree for resynthesis (0 < num < 6) [default = %d]\n"
                  ,(ulong)(uint)fVeryVerbose);
        pcVar3 = "unit";
        if (Degree != 0) {
          pcVar3 = "lib";
        }
        Abc_Print(-2,"\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n",
                  pcVar3);
        pcVar3 = "no";
        if (local_4c != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (local_50 != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",
                  pcVar3);
        Abc_Print(-2,"\t-h       : print the command usage\n");
        return 1;
      }
      fVeryVerbose = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((fVeryVerbose < 1) || (5 < fVeryVerbose)) goto LAB_00263c15;
      break;
    default:
      goto LAB_00263c15;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_00263c15;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((fVerbose < 1) || (100 < fVerbose)) goto LAB_00263c15;
      break;
    case 0x68:
      goto LAB_00263c15;
    case 0x6c:
      Degree = Degree ^ 1;
      break;
    case 0x76:
      local_4c = local_4c ^ 1;
      break;
    case 0x77:
      local_50 = local_50 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSpeedup( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fUseLutLib;
    int Percentage;
    int Degree;
    int fVerbose;
    int fVeryVerbose;
    extern Abc_Ntk_t * Abc_NtkSpeedup( Abc_Ntk_t * pNtk, int fUseLutLib, int Percentage, int Degree, int fVerbose, int fVeryVerbose );
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fUseLutLib = 0;
    Percentage = 5;
    Degree     = 2;
    fVerbose   = 0;
    fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PNlvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            Percentage = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Percentage < 1 || Percentage > 100 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            Degree = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Degree < 1 || Degree > 5 )
                goto usage;
            break;
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }

    // modify the current network
    pNtkRes = Abc_NtkSpeedup( pNtk, fUseLutLib, Percentage, Degree, fVerbose, fVeryVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: speedup [-PN <num>] [-lvwh]\n" );
    Abc_Print( -2, "\t           transforms LUT-mapped network into an AIG with choices;\n" );
    Abc_Print( -2, "\t           the choices are added to speedup the next round of mapping\n" );
    Abc_Print( -2, "\t-P <num> : delay delta defining critical path for library model [default = %d%%]\n", Percentage );
    Abc_Print( -2, "\t-N <num> : the max critical path degree for resynthesis (0 < num < 6) [default = %d]\n", Degree );
    Abc_Print( -2, "\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n", fUseLutLib? "lib" : "unit" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}